

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  int *piVar9;
  float *pfVar10;
  size_t sVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  long lVar16;
  Mat *pMVar17;
  undefined4 in_EAX;
  int i;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  int i_1;
  int iVar27;
  ulong uVar28;
  void *pvVar29;
  long lVar30;
  ulong uVar31;
  int k;
  ulong uVar32;
  void *pvVar33;
  size_type __n;
  int i_3;
  void *pvVar34;
  ulong uVar35;
  ulong uVar36;
  undefined4 uVar37;
  float fVar38;
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  void *local_1c0;
  allocator_type local_191;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  void *local_178;
  long local_170;
  long local_168;
  long local_160;
  Mat local_158;
  ulong local_108;
  void *local_100;
  void *local_f8;
  void *local_f0;
  ulong local_e8;
  void *local_e0;
  size_t local_d8;
  ulong local_d0;
  ulong local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  Option *local_b0;
  long local_a8;
  ulong local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  Mat *local_78;
  long local_70;
  long local_68;
  ulong local_60;
  void *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  iVar21 = bottom_blob->w;
  iVar24 = bottom_blob->h;
  iVar2 = this->kernel_w;
  iVar3 = this->dilation_w;
  sVar8 = bottom_blob->elemsize;
  iVar4 = this->stride_w;
  iVar5 = this->kernel_h;
  iVar6 = this->dilation_h;
  iVar20 = this->stride_h;
  iVar23 = this->output_pad_right;
  iVar27 = this->output_pad_bottom;
  local_158.cstep = 0;
  local_158.data = (void *)0x0;
  local_158.refcount._0_4_ = 0;
  local_158.refcount._4_4_ = 0;
  local_158.elemsize = 0;
  local_158.elempack = 0;
  local_158.allocator = (Allocator *)0x0;
  local_158.dims = 0;
  local_158.w = 0;
  local_158.h = 0;
  local_158.d = 0;
  local_158.c = 0;
  auVar39._0_4_ = -(uint)(0 < this->pad_left);
  auVar39._4_4_ = -(uint)(0 < this->pad_right);
  auVar39._8_4_ = -(uint)(0 < this->pad_top);
  auVar39._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar18 = movmskps(in_EAX,auVar39);
  lVar30 = 0x10;
  if ((iVar18 == 0) &&
     (((this->output_w < 1 || (this->output_h < 1)) && (lVar30 = 8, &local_158 != top_blob)))) {
    piVar9 = top_blob->refcount;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    local_158.data = top_blob->data;
    local_158.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_158.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_158.elemsize = top_blob->elemsize;
    local_158.elempack = top_blob->elempack;
    local_158.allocator = top_blob->allocator;
    uVar12 = top_blob->dims;
    uVar13 = top_blob->w;
    uVar14 = top_blob->h;
    uVar15 = top_blob->d;
    local_158.c = top_blob->c;
    local_158.cstep = top_blob->cstep;
    local_158.dims = uVar12;
    local_158.w = uVar13;
    local_158.h = uVar14;
    local_158.d = uVar15;
  }
  local_b0 = opt;
  Mat::create(&local_158,iVar23 + (iVar2 + -1) * iVar3 + (iVar21 + -1) * iVar4 + 1,
              iVar27 + 1 + (iVar5 + -1) * iVar6 + (iVar24 + -1) * iVar20,this->num_output,sVar8,
              *(Allocator **)(&opt->lightmode + lVar30));
  iVar24 = local_158.w;
  iVar21 = -100;
  if ((local_158.data != (void *)0x0) && (local_158.cstep * (long)local_158.c != 0)) {
    iVar21 = this->kernel_w;
    iVar2 = this->kernel_h;
    local_170 = (long)this->stride_w;
    local_168 = (long)this->stride_h;
    iVar3 = this->dilation_w;
    iVar4 = this->dilation_h;
    local_108 = (ulong)(uint)this->group;
    local_a0 = (ulong)(uint)this->activation_type;
    iVar5 = bottom_blob->c;
    uVar19 = iVar2 * iVar21;
    __n = (size_type)(int)uVar19;
    local_188 = (long)local_158.c;
    local_78 = top_blob;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,&local_191);
    iVar20 = 0;
    iVar6 = iVar21;
    if (iVar21 < 1) {
      iVar6 = iVar20;
    }
    if (iVar2 < 1) {
      iVar2 = iVar20;
    }
    iVar18 = 0;
    iVar27 = 0;
    iVar23 = iVar6;
    for (; iVar20 != iVar2; iVar20 = iVar20 + 1) {
      for (lVar30 = (long)iVar27; iVar23 != lVar30; lVar30 = lVar30 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar30] = iVar18;
        iVar18 = iVar18 + iVar3;
      }
      iVar18 = iVar18 + (iVar24 * iVar4 - iVar3 * iVar21);
      iVar23 = iVar23 + iVar6;
      iVar27 = iVar27 + iVar6;
    }
    iVar21 = (int)local_108;
    iVar24 = (int)local_188;
    if (iVar24 == iVar21 && iVar5 == iVar21) {
      local_190 = bottom_blob->elemsize * bottom_blob->cstep;
      local_100 = (this->bias_data).data;
      local_160 = local_158.cstep * local_158.elemsize;
      local_c8 = (long)local_158.h * (long)local_158.w;
      local_d0 = local_158.elemsize * local_c8 + 0xf & 0xfffffffffffffff0;
      uVar7 = bottom_blob->w;
      local_178 = (void *)(long)(int)uVar7;
      uVar35 = 0;
      if (0 < (int)uVar19) {
        uVar35 = (ulong)uVar19;
      }
      uVar36 = 0;
      if (0 < (int)uVar7) {
        uVar36 = (ulong)uVar7;
      }
      uVar19 = bottom_blob->h;
      if (bottom_blob->h < 1) {
        uVar19 = 0;
      }
      local_e0 = bottom_blob->data;
      uVar7 = local_158.h * local_158.w;
      if (local_158.h * local_158.w < 1) {
        uVar7 = 0;
      }
      local_180 = (ulong)uVar7;
      local_188 = local_188 & 0xffffffff;
      if (iVar24 < 1) {
        local_188 = 0;
      }
      pvVar34 = (this->weight_data).data;
      local_d8 = CONCAT71(local_d8._1_7_,
                          (long)(this->bias_data).c * (this->bias_data).cstep == 0 ||
                          local_100 == (void *)0x0);
      local_98._0_8_ = local_158.elemsize;
      local_168 = local_168 * local_158.w * local_158.elemsize;
      local_e8 = CONCAT44(local_e8._4_4_,local_158.d);
      local_f8 = (void *)CONCAT44(local_f8._4_4_,local_158.dims);
      local_f0 = local_158.data;
      pvVar29 = local_158.data;
      for (uVar28 = 0; uVar28 != local_188; uVar28 = uVar28 + 1) {
        iVar21 = (int)(local_d0 / (ulong)local_98._0_8_);
        if ((int)local_f8 == 4) {
          iVar21 = (int)local_c8;
        }
        uVar37 = 0;
        if ((char)local_d8 == '\0') {
          uVar37 = *(undefined4 *)((long)local_100 + uVar28 * 4);
        }
        iVar21 = iVar21 * (int)local_e8;
        if (iVar21 < 1) {
          iVar21 = 0;
        }
        for (lVar30 = 0; iVar21 != (int)lVar30; lVar30 = lVar30 + 1) {
          *(undefined4 *)((long)pvVar29 + lVar30 * 4) = uVar37;
        }
        for (uVar22 = 0; uVar22 != uVar19; uVar22 = uVar22 + 1) {
          for (uVar31 = 0; uVar31 != uVar36; uVar31 = uVar31 + 1) {
            lVar30 = uVar31 * local_170 * 4 + local_168 * uVar22 + local_160 * uVar28;
            fVar38 = *(float *)((long)local_e0 +
                               uVar31 * 4 + uVar22 * (long)local_178 * 4 + local_190 * uVar28);
            for (uVar32 = 0; uVar35 != uVar32; uVar32 = uVar32 + 1) {
              *(float *)((long)local_f0 +
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar32] * 4 + lVar30) =
                   *(float *)((long)pvVar34 + uVar32 * 4) * fVar38 +
                   *(float *)((long)local_f0 +
                             (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar32] * 4 + lVar30);
            }
          }
        }
        pfVar10 = (float *)(this->activation_params).data;
        uVar22 = local_180;
        for (uVar31 = 0; uVar22 != uVar31; uVar31 = uVar31 + 1) {
          fVar38 = *(float *)((long)pvVar29 + uVar31 * 4);
          fVar41 = fVar38;
          switch((int)local_a0) {
          case 1:
            if (fVar38 <= 0.0) {
              fVar41 = 0.0;
            }
            break;
          case 2:
            fVar41 = (float)(~-(uint)(0.0 < fVar38) & (uint)*pfVar10 |
                            -(uint)(0.0 < fVar38) & 0x3f800000) * fVar38;
            break;
          case 3:
            if (fVar38 <= *pfVar10) {
              fVar38 = *pfVar10;
            }
            fVar41 = pfVar10[1];
            if (fVar38 <= pfVar10[1]) {
              fVar41 = fVar38;
            }
            break;
          case 4:
            if (88.37626 <= fVar38) {
              fVar38 = 88.37626;
            }
            fVar38 = expf((float)(-(uint)(fVar38 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar38 < -88.37626) & (uint)-fVar38));
            uVar22 = local_180;
            fVar41 = 1.0 / (fVar38 + 1.0);
            break;
          case 5:
            local_88 = ZEXT416((uint)fVar38);
            fVar38 = expf(fVar38);
            fVar38 = logf(fVar38 + 1.0);
            fVar38 = tanhf(fVar38);
            uVar22 = local_180;
            fVar41 = fVar38 * (float)local_88._0_4_;
            break;
          case 6:
            fVar1 = *pfVar10;
            fVar40 = -pfVar10[1] / fVar1;
            fVar41 = 0.0;
            if ((fVar40 <= fVar38) && (fVar41 = fVar38, fVar38 <= fVar40 + 1.0 / fVar1)) {
              fVar41 = (fVar1 * fVar38 + pfVar10[1]) * fVar38;
            }
          }
          *(float *)((long)pvVar29 + uVar31 * 4) = fVar41;
        }
        pvVar29 = (void *)((long)pvVar29 + local_160);
        pvVar34 = (void *)((long)pvVar34 + __n * 4);
      }
    }
    else {
      uVar35 = (long)iVar5 / (long)iVar21;
      uVar36 = (long)((ulong)(uint)(iVar24 >> 0x1f) << 0x20 | local_188 & 0xffffffff) / (long)iVar21
      ;
      iVar24 = (int)uVar35;
      uVar28 = 0;
      if (0 < (int)uVar19) {
        uVar28 = (ulong)uVar19;
      }
      uVar22 = 0;
      if (0 < iVar24) {
        uVar22 = uVar35 & 0xffffffff;
      }
      local_bc = (int)uVar36;
      local_c8 = 0;
      if (0 < local_bc) {
        local_c8 = uVar36 & 0xffffffff;
      }
      local_68 = (long)iVar24;
      local_70 = (long)local_bc;
      local_108 = local_108 & 0xffffffff;
      if (iVar21 < 1) {
        local_108 = 0;
      }
      local_bc = local_bc * iVar24 * uVar19;
      local_50 = (long)(int)(iVar24 * uVar19) << 2;
      iVar21 = 0;
      local_a8 = 0;
      uVar35 = 0;
      while (auVar39 = local_88, uVar35 != local_108) {
        local_d0 = uVar35 * local_70;
        local_160 = local_158.cstep * local_158.elemsize;
        local_e0 = (void *)((long)local_158.h * (long)local_158.w);
        local_e8 = local_158.elemsize * (long)local_e0 + 0xf & 0xfffffffffffffff0;
        local_58 = (this->bias_data).data;
        lVar30 = uVar35 * local_68;
        uVar36 = (ulong)(uint)bottom_blob->w;
        if (bottom_blob->w < 1) {
          uVar36 = 0;
        }
        local_88._0_4_ = bottom_blob->h;
        if (bottom_blob->h < 1) {
          local_88._0_4_ = 0;
        }
        local_88._4_4_ = 0;
        local_88._8_8_ = auVar39._8_8_;
        uVar19 = local_158.h * local_158.w;
        if (local_158.h * local_158.w < 1) {
          uVar19 = 0;
        }
        local_180 = (ulong)uVar19;
        local_f0 = (void *)CONCAT71(local_f0._1_7_,
                                    (long)(this->bias_data).c * (this->bias_data).cstep == 0 ||
                                    local_58 == (void *)0x0);
        local_d8 = local_158.elemsize;
        local_188 = local_158.w * local_168 * local_158.elemsize;
        local_1c0 = (void *)((long)iVar21 * 4 + (long)(this->weight_data).data);
        local_f8 = local_158.data;
        pvVar34 = (void *)(local_160 * local_a8 + (long)local_158.data);
        local_100 = (void *)CONCAT44(local_100._4_4_,local_158.d);
        local_b4 = local_158.dims;
        local_b8 = iVar21;
        local_60 = uVar35;
        for (uVar31 = 0; uVar31 != local_c8; uVar31 = uVar31 + 1) {
          iVar21 = (int)(local_e8 / local_d8);
          if (local_b4 == 4) {
            iVar21 = (int)local_e0;
          }
          uVar37 = 0;
          if ((char)local_f0 == '\0') {
            uVar37 = *(undefined4 *)((long)local_58 + (uVar31 + local_d0) * 4);
          }
          iVar21 = iVar21 * (int)local_100;
          if (iVar21 < 1) {
            iVar21 = 0;
          }
          for (lVar25 = 0; iVar21 != (int)lVar25; lVar25 = lVar25 + 1) {
            *(undefined4 *)((long)pvVar34 + lVar25 * 4) = uVar37;
          }
          for (lVar25 = 0; lVar25 != local_88._0_8_; lVar25 = lVar25 + 1) {
            for (uVar35 = 0; uVar35 != uVar36; uVar35 = uVar35 + 1) {
              lVar16 = uVar35 * local_170 * 4 + local_188 * lVar25 + (uVar31 + local_d0) * local_160
              ;
              iVar21 = bottom_blob->w;
              sVar8 = bottom_blob->elemsize;
              sVar11 = bottom_blob->cstep;
              pvVar29 = bottom_blob->data;
              pvVar33 = local_1c0;
              for (uVar32 = 0; uVar32 != uVar22; uVar32 = uVar32 + 1) {
                fVar38 = *(float *)((long)pvVar29 +
                                   (uVar32 + lVar30) * sVar11 * sVar8 +
                                   uVar35 * 4 + iVar21 * lVar25 * sVar8);
                for (uVar26 = 0; uVar28 != uVar26; uVar26 = uVar26 + 1) {
                  *(float *)((long)local_f8 +
                            (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar26] * 4 + lVar16) =
                       *(float *)((long)pvVar33 + uVar26 * 4) * fVar38 +
                       *(float *)((long)local_f8 +
                                 (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start[uVar26] * 4 + lVar16
                                 );
                }
                pvVar33 = (void *)((long)pvVar33 + __n * 4);
              }
            }
          }
          pfVar10 = (float *)(this->activation_params).data;
          local_190 = uVar31;
          local_178 = pvVar34;
          for (uVar35 = 0; local_180 != uVar35; uVar35 = uVar35 + 1) {
            fVar38 = *(float *)((long)pvVar34 + uVar35 * 4);
            fVar41 = fVar38;
            switch((int)local_a0) {
            case 1:
              if (fVar38 <= 0.0) {
                fVar41 = 0.0;
              }
              break;
            case 2:
              fVar41 = (float)(~-(uint)(0.0 < fVar38) & (uint)*pfVar10 |
                              -(uint)(0.0 < fVar38) & 0x3f800000) * fVar38;
              break;
            case 3:
              if (fVar38 <= *pfVar10) {
                fVar38 = *pfVar10;
              }
              fVar41 = pfVar10[1];
              if (fVar38 <= pfVar10[1]) {
                fVar41 = fVar38;
              }
              break;
            case 4:
              if (88.37626 <= fVar38) {
                fVar38 = 88.37626;
              }
              fVar38 = expf((float)(-(uint)(fVar38 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar38 < -88.37626) & (uint)-fVar38));
              uVar31 = local_190;
              pvVar34 = local_178;
              fVar41 = 1.0 / (fVar38 + 1.0);
              break;
            case 5:
              local_98 = ZEXT416((uint)fVar38);
              fVar38 = expf(fVar38);
              fVar38 = logf(fVar38 + 1.0);
              fVar38 = tanhf(fVar38);
              uVar31 = local_190;
              pvVar34 = local_178;
              fVar41 = fVar38 * (float)local_98._0_4_;
              break;
            case 6:
              fVar1 = *pfVar10;
              fVar40 = -pfVar10[1] / fVar1;
              fVar41 = 0.0;
              if ((fVar40 <= fVar38) && (fVar41 = fVar38, fVar38 <= fVar40 + 1.0 / fVar1)) {
                fVar41 = (fVar1 * fVar38 + pfVar10[1]) * fVar38;
              }
            }
            *(float *)((long)pvVar34 + uVar35 * 4) = fVar41;
          }
          pvVar34 = (void *)((long)pvVar34 + local_160);
          local_1c0 = (void *)((long)local_1c0 + local_50);
        }
        local_a8 = local_a8 + local_70;
        iVar21 = local_b8 + local_bc;
        uVar35 = local_60 + 1;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    pMVar17 = local_78;
    cut_padding(this,&local_158,local_78,local_b0);
    if ((pMVar17->data == (void *)0x0) || (iVar21 = 0, (long)pMVar17->c * pMVar17->cstep == 0)) {
      iVar21 = -100;
    }
  }
  piVar9 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        free(local_158.data);
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}